

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

int __thiscall rcg::System::open(System *this,char *__file,int __oflag,...)

{
  GC_ERROR GVar1;
  int iVar2;
  GenTLException *this_00;
  allocator local_41;
  string local_40;
  
  std::recursive_mutex::lock(&this->mtx);
  iVar2 = this->n_open;
  if (iVar2 == 0) {
    GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->TLOpen)(&this->tl);
    if (GVar1 != 0) {
      this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_40,"System::open()",&local_41);
      GenTLException::GenTLException(this_00,&local_40,&this->gentl);
      __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    iVar2 = this->n_open;
  }
  this->n_open = iVar2 + 1;
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar2;
}

Assistant:

void System::open()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open == 0)
  {
    if (gentl->TLOpen(&tl) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::open()", gentl);
    }
  }

  n_open++;
}